

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O1

void duckdb::UniqueFunctor::
     ListExecuteFunction<duckdb::FinalizeStringValueFunctor,duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  idx_t iVar3;
  idx_t iVar4;
  undefined8 uVar5;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_68;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
  Vector::ToUnifiedFormat(state_vector,count,&local_68);
  if (count != 0) {
    pdVar1 = result->data;
    psVar2 = (local_68.sel)->sel_vector;
    iVar3 = 0;
    do {
      iVar4 = iVar3;
      if (psVar2 != (sel_t *)0x0) {
        iVar4 = (idx_t)psVar2[iVar3];
      }
      if (**(long **)(local_68.data + iVar4 * 8) == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(undefined8 *)(**(long **)(local_68.data + iVar4 * 8) + 0x20);
      }
      *(undefined8 *)(pdVar1 + iVar3 * 8) = uVar5;
      iVar3 = iVar3 + 1;
    } while (count != iVar3);
  }
  Vector::Verify(result,count);
  if (local_68.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto result_data = FlatVector::GetData<uint64_t>(result);
		for (idx_t i = 0; i < count; i++) {

			auto state = states[sdata.sel->get_index(i)];

			if (!state->hist) {
				result_data[i] = 0;
				continue;
			}
			result_data[i] = state->hist->size();
		}
		result.Verify(count);
	}